

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O3

void __thiscall
bssl::(anonymous_namespace)::SSLVersionTest_DefaultTicketKeyRotation_Test::
~SSLVersionTest_DefaultTicketKeyRotation_Test(SSLVersionTest_DefaultTicketKeyRotation_Test *this)

{
  *(undefined ***)(this + -0x10) = &PTR__SSLVersionTest_00429750;
  *(undefined ***)this = &PTR__SSLVersionTest_00429790;
  std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)(this + 0x38));
  std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<x509_st,_bssl::internal::Deleter> *)(this + 0x30));
  std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)(this + 0x28));
  std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)(this + 0x20));
  std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)(this + 0x18));
  std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)(this + 0x10));
  testing::Test::~Test((Test *)(this + -0x10));
  operator_delete((Test *)(this + -0x10),0x50);
  return;
}

Assistant:

TEST_P(SSLVersionTest, DefaultTicketKeyRotation) {
  static const time_t kStartTime = 1001;
  g_current_time.tv_sec = kStartTime;

  // We use session reuse as a proxy for ticket decryption success, hence
  // disable session timeouts.
  SSL_CTX_set_timeout(server_ctx_.get(), std::numeric_limits<uint32_t>::max());
  SSL_CTX_set_session_psk_dhe_timeout(server_ctx_.get(),
                                      std::numeric_limits<uint32_t>::max());

  SSL_CTX_set_current_time_cb(client_ctx_.get(), FrozenTimeCallback);
  SSL_CTX_set_current_time_cb(server_ctx_.get(), CurrentTimeCallback);

  SSL_CTX_set_session_cache_mode(client_ctx_.get(), SSL_SESS_CACHE_BOTH);
  SSL_CTX_set_session_cache_mode(server_ctx_.get(), SSL_SESS_CACHE_OFF);

  // Initialize ticket_key with the current key and check that it was
  // initialized to something, not all zeros.
  uint8_t ticket_key[kTicketKeyLen] = {0};
  TRACED_CALL(ExpectTicketKeyChanged(server_ctx_.get(), ticket_key,
                                     true /* changed */));

  // Verify ticket resumption actually works.
  bssl::UniquePtr<SSL_SESSION> session =
      CreateClientSession(client_ctx_.get(), server_ctx_.get());
  ASSERT_TRUE(session);
  TRACED_CALL(ExpectSessionReused(client_ctx_.get(), server_ctx_.get(),
                                  session.get(), true /* reused */));

  // Advance time to just before key rotation.
  g_current_time.tv_sec += SSL_DEFAULT_TICKET_KEY_ROTATION_INTERVAL - 1;
  TRACED_CALL(ExpectSessionReused(client_ctx_.get(), server_ctx_.get(),
                                  session.get(), true /* reused */));
  TRACED_CALL(ExpectTicketKeyChanged(server_ctx_.get(), ticket_key,
                                     false /* NOT changed */));

  // Force key rotation.
  g_current_time.tv_sec += 1;
  bssl::UniquePtr<SSL_SESSION> new_session =
      CreateClientSession(client_ctx_.get(), server_ctx_.get());
  TRACED_CALL(ExpectTicketKeyChanged(server_ctx_.get(), ticket_key,
                                     true /* changed */));

  // Resumption with both old and new ticket should work.
  TRACED_CALL(ExpectSessionReused(client_ctx_.get(), server_ctx_.get(),
                                  session.get(), true /* reused */));
  TRACED_CALL(ExpectSessionReused(client_ctx_.get(), server_ctx_.get(),
                                  new_session.get(), true /* reused */));
  TRACED_CALL(ExpectTicketKeyChanged(server_ctx_.get(), ticket_key,
                                     false /* NOT changed */));

  // Force key rotation again. Resumption with the old ticket now fails.
  g_current_time.tv_sec += SSL_DEFAULT_TICKET_KEY_ROTATION_INTERVAL;
  TRACED_CALL(ExpectSessionReused(client_ctx_.get(), server_ctx_.get(),
                                  session.get(), false /* NOT reused */));
  TRACED_CALL(ExpectTicketKeyChanged(server_ctx_.get(), ticket_key,
                                     true /* changed */));

  // But resumption with the newer session still works.
  TRACED_CALL(ExpectSessionReused(client_ctx_.get(), server_ctx_.get(),
                                  new_session.get(), true /* reused */));
}